

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffcrow(fitsfile *fptr,int datatype,char *expr,long firstrow,long nelements,void *nulval,
          void *array,int *anynul,int *status)

{
  int iVar1;
  long in_RCX;
  int in_ESI;
  long in_R8;
  long in_R9;
  undefined4 *in_stack_00000010;
  int *in_stack_00000018;
  ParseData lParse;
  long naxes [5];
  long nelem1;
  int naxis;
  parseInfo Info;
  ParseData *lParse_00;
  long local_1f8;
  undefined1 local_1f0 [96];
  long *in_stack_fffffffffffffe70;
  int *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  char *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe94;
  fitsfile *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffeb0;
  long *in_stack_fffffffffffffeb8;
  ParseData *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  undefined1 local_108 [200];
  long local_40;
  long local_38;
  long local_30;
  int local_1c;
  int local_c;
  
  if (*in_stack_00000018 == 0) {
    local_40 = in_R9;
    local_38 = in_R8;
    local_30 = in_RCX;
    local_1c = in_ESI;
    memset(local_108 + 0x38,0,0x90);
    lParse_00 = (ParseData *)local_108;
    iVar1 = ffiprs(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,
                   in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffec8);
    if (iVar1 == 0) {
      if ((long)local_108._40_8_ < 0) {
        local_108._40_8_ = -local_108._40_8_;
      }
      if (local_38 < (long)local_108._40_8_) {
        ffcprs(lParse_00);
        ffpmsg((char *)0x12d04c);
        *in_stack_00000018 = 0x1b1;
        local_c = 0x1b1;
      }
      else {
        if (local_30 < 2) {
          local_1f8 = 1;
        }
        else {
          local_1f8 = local_30;
        }
        local_30 = local_1f8;
        if (local_1c != 0) {
          local_108._56_4_ = local_1c;
        }
        local_108._72_8_ = local_40;
        local_108._80_8_ = local_38 / (long)local_108._40_8_;
        local_108._96_8_ = local_1f0;
        iVar1 = ffiter((int)lParse.nPrevDataRows,(iteratorCol *)lParse.totalRows,lParse.nDataRows,
                       lParse.firstDataRow,
                       (_func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *)
                       lParse.pixFilter,lParse.varData,(int *)naxes[0]);
        if (iVar1 == -1) {
          *in_stack_00000018 = 0;
        }
        *in_stack_00000010 = local_108._88_4_;
        ffcprs(lParse_00);
        local_c = *in_stack_00000018;
      }
    }
    else {
      ffcprs(lParse_00);
      local_c = *in_stack_00000018;
    }
  }
  else {
    local_c = *in_stack_00000018;
  }
  return local_c;
}

Assistant:

int ffcrow( fitsfile *fptr,      /* I - Input FITS file                      */
            int      datatype,   /* I - Datatype to return results as        */
            char     *expr,      /* I - Arithmetic expression                */
            long     firstrow,   /* I - First row to evaluate                */
            long     nelements,  /* I - Number of elements to return         */
            void     *nulval,    /* I - Ptr to value to use as UNDEF         */
            void     *array,     /* O - Array of results                     */
            int      *anynul,    /* O - Were any UNDEFs encountered?         */
            int      *status )   /* O - Error status                         */
/*                                                                           */
/* Calculate an expression for the indicated rows of a table, returning      */
/* the results, cast as datatype (TSHORT, TDOUBLE, etc), in array.  If       */
/* nulval==NULL, UNDEFs will be zeroed out.  For vector results, the number  */
/* of elements returned may be less than nelements if nelements is not an    */
/* even multiple of the result dimension.  Call fftexp to obtain the         */
/* dimensions of the results.                                                */
/*---------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis;
   long nelem1, naxes[MAXDIMS];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem1, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }
   if( nelem1<0 ) nelem1 = - nelem1;

   if( nelements<nelem1 ) {
      ffcprs(&lParse);
      ffpmsg("Array not large enough to hold at least one row of data.");
      return( *status = PARSE_LRG_VECTOR );
   }

   firstrow = (firstrow>1 ? firstrow : 1);

   if( datatype ) Info.datatype = datatype;

   Info.dataPtr = array;
   Info.nullPtr = nulval;
   Info.maxRows = nelements / nelem1;
   Info.parseData = &lParse;
   
   if( ffiter( lParse.nCols, lParse.colData, firstrow-1, 0,
               fits_parser_workfn, (void*)&Info, status ) == -1 )
      *status=0;  /* -1 indicates exitted without error before end... OK */

   *anynul = Info.anyNull;
   ffcprs(&lParse);
   return( *status );
}